

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O0

void MultARGBRow(uint8_t *ptr,int width)

{
  uint a;
  uint32_t uVar1;
  uint32_t uVar2;
  int in_ESI;
  uint8_t *in_RDI;
  uint32_t scale;
  uint32_t alpha;
  int x;
  int local_10;
  uint8_t *local_8;
  
  local_8 = in_RDI;
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    a = (uint)local_8[3];
    if (a < 0xff) {
      if (a == 0) {
        local_8[2] = '\0';
        local_8[1] = '\0';
        *local_8 = '\0';
      }
      else {
        uVar1 = GetScale(a);
        uVar2 = Unmult(*local_8,uVar1);
        *local_8 = (uint8_t)uVar2;
        uVar2 = Unmult(local_8[1],uVar1);
        local_8[1] = (uint8_t)uVar2;
        uVar1 = Unmult(local_8[2],uVar1);
        local_8[2] = (uint8_t)uVar1;
      }
    }
    local_8 = local_8 + 4;
  }
  return;
}

Assistant:

static void MultARGBRow(uint8_t* ptr, int width) {
  int x;
  for (x = 0; x < width; ++x, ptr += 4) {
    const uint32_t alpha = ptr[3];
    if (alpha < 255) {
      if (alpha == 0) {   // alpha == 0
        ptr[0] = ptr[1] = ptr[2] = 0;
      } else {
        const uint32_t scale = GetScale(alpha);
        ptr[0] = Unmult(ptr[0], scale);
        ptr[1] = Unmult(ptr[1], scale);
        ptr[2] = Unmult(ptr[2], scale);
      }
    }
  }
}